

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBillboardSceneNode.cpp
# Opt level: O2

void __thiscall irr::scene::CBillboardSceneNode::clone(CBillboardSceneNode *this)

{
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  void *in_R8;
  
  clone((CBillboardSceneNode *)
        ((long)&this->_vptr_CBillboardSceneNode + (long)this->_vptr_CBillboardSceneNode[-0x25]),
        in_RSI,in_RDX,in_ECX,in_R8);
  return;
}

Assistant:

ISceneNode *CBillboardSceneNode::clone(ISceneNode *newParent, ISceneManager *newManager)
{
	if (!newParent)
		newParent = Parent;
	if (!newManager)
		newManager = SceneManager;

	CBillboardSceneNode *nb = new CBillboardSceneNode(newParent,
			newManager, ID, RelativeTranslation, Size);

	nb->cloneMembers(this, newManager);
	nb->Buffer->Material = Buffer->Material;
	nb->Size = Size;
	nb->TopEdgeWidth = this->TopEdgeWidth;

	video::SColor topColor, bottomColor;
	getColor(topColor, bottomColor);
	nb->setColor(topColor, bottomColor);

	if (newParent)
		nb->drop();
	return nb;
}